

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O0

double parse_timestamp(utf8_char_t *line)

{
  int iVar1;
  undefined8 in_RDI;
  int ms;
  int ss;
  int mm;
  int hh;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 local_10;
  double local_8;
  
  local_10 = in_RDI;
  iVar1 = __isoc99_sscanf(in_RDI,"%d:%2d:%2d%*1[,.]%3d",&local_14,&local_18,&local_1c,&local_20);
  if (iVar1 == 4) {
    local_8 = (double)local_14 * 3600.0 + (double)local_18 * 60.0 + (double)local_1c +
              (double)local_20 / 1000.0;
  }
  else {
    iVar1 = __isoc99_sscanf(local_10,"%2d:%2d%*1[,.]%3d",&local_18,&local_1c,&local_20);
    if (iVar1 == 3) {
      local_8 = (double)local_18 * 60.0 + 0.0 + (double)local_1c + (double)local_20 / 1000.0;
    }
    else {
      local_8 = -1.0;
    }
  }
  return local_8;
}

Assistant:

double parse_timestamp(const utf8_char_t* line)
{
    int hh, mm, ss, ms;
    if (sscanf(line, "%d:%2d:%2d%*1[,.]%3d", &hh, &mm, &ss, &ms) == 4) {
        return VTTTIME2SECONDS(hh, mm, ss, ms);
    }
    if (sscanf(line, "%2d:%2d%*1[,.]%3d", &mm, &ss, &ms) == 3) {
        return VTTTIME2SECONDS(0.0, mm, ss, ms);
    }
    return -1.0;
}